

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall
amrex::ParmParse::queryarr
          (ParmParse *this,char *name,vector<amrex::Box,_std::allocator<amrex::Box>_> *ptr,
          int start_ix,int num_val)

{
  bool bVar1;
  char *in_RSI;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,in_RSI,(allocator *)&stack0xffffffffffffff9f);
  prefixedName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = anon_unknown_12::anon_unknown_0::squeryarr<amrex::Box>
                    ((Table *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  return (uint)bVar1;
}

Assistant:

int
ParmParse::queryarr (const char*     name,
                     std::vector<Box>& ptr,
                     int             start_ix,
                     int             num_val) const
{
    return squeryarr(m_table, prefixedName(name),ptr,start_ix,num_val, LAST);
}